

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>
::destroy_value(sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_slang::SourceManager::FileData_*,_false> __ptr;
  pointer pcVar2;
  
  __ptr._M_head_impl =
       (this->field_1).value.second._M_t.
       super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
       ._M_t.
       super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
       .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&(this->field_1).value.second,
               __ptr._M_head_impl);
  }
  (this->field_1).value.second._M_t.
  super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
  ._M_t.
  super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl = (FileData *)0x0;
  pcVar2 = (this->field_1).value.first._M_dataplus._M_p;
  paVar1 = &(this->field_1).value.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this->distance_from_desired = -1;
  return;
}

Assistant:

void destroy_value()
    {
        value.~T();
        distance_from_desired = -1;
    }